

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateSymbolTest
          (Lowerer *this,RegOpnd *srcReg,Instr *insertInstr,LabelInstr *labelHelper,
          LabelInstr *continueLabel,bool generateObjectCheck)

{
  code *pcVar1;
  Instr *baseOpnd;
  bool bVar2;
  uint32 offset;
  undefined4 *puVar3;
  IndirOpnd *compareSrc1;
  Opnd *compareSrc2;
  Opnd *src2;
  IndirOpnd *src1;
  LabelInstr *pLStack_30;
  bool generateObjectCheck_local;
  LabelInstr *continueLabel_local;
  LabelInstr *labelHelper_local;
  Instr *insertInstr_local;
  RegOpnd *srcReg_local;
  Lowerer *this_local;
  
  src1._7_1_ = generateObjectCheck;
  pLStack_30 = continueLabel;
  continueLabel_local = labelHelper;
  labelHelper_local = (LabelInstr *)insertInstr;
  insertInstr_local = (Instr *)srcReg;
  srcReg_local = (RegOpnd *)this;
  if (srcReg == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6ea1,"(srcReg)","srcReg");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  src1._4_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType((Opnd *)insertInstr_local);
  bVar2 = ValueType::IsSymbol((ValueType *)((long)&src1 + 4));
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    if (((src1._7_1_ & 1) != 0) &&
       (bVar2 = IR::Opnd::IsNotTaggedValue((Opnd *)insertInstr_local), !bVar2)) {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,(Opnd *)insertInstr_local,&labelHelper_local->super_Instr,
                 continueLabel_local,false);
    }
    baseOpnd = insertInstr_local;
    offset = Js::RecyclableObject::GetOffsetOfType();
    compareSrc1 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,offset,TyInt64,this->m_func,false);
    compareSrc2 = LoadLibraryValueOpnd(this,&labelHelper_local->super_Instr,ValueSymbolTypeStatic);
    if (pLStack_30 == (LabelInstr *)0x0) {
      InsertCompareBranch(this,&compareSrc1->super_Opnd,compareSrc2,BrNeq_A,continueLabel_local,
                          &labelHelper_local->super_Instr,false);
    }
    else {
      InsertCompareBranch(this,&compareSrc1->super_Opnd,compareSrc2,BrEq_A,pLStack_30,
                          &labelHelper_local->super_Instr,false);
    }
  }
  return;
}

Assistant:

void
Lowerer::GenerateSymbolTest(IR::RegOpnd *srcReg, IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr * continueLabel, bool generateObjectCheck)
{
    Assert(srcReg);
    if (!srcReg->GetValueType().IsSymbol())
    {
        if (generateObjectCheck && !srcReg->IsNotTaggedValue())
        {
            this->m_lowererMD.GenerateObjectTest(srcReg, insertInstr, labelHelper);
        }

        // CMP [regSrcStr + offset(type)] , static symbol type   -- check base symbol type
        // BrEq/BrNeq labelHelper.
        IR::IndirOpnd * src1 = IR::IndirOpnd::New(srcReg, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, m_func);
        IR::Opnd * src2 = this->LoadLibraryValueOpnd(insertInstr, LibraryValue::ValueSymbolTypeStatic);
        if (continueLabel)
        {
            InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, continueLabel, insertInstr);
        }
        else
        {
            InsertCompareBranch(src1, src2, Js::OpCode::BrNeq_A, labelHelper, insertInstr);
        }
    }
}